

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Board.cpp
# Opt level: O0

void __thiscall Board::insert(Board *this,Block block,int idToInsert)

{
  bool bVar1;
  int local_1c;
  int local_18;
  int i_1;
  int i;
  int idToInsert_local;
  Board *this_local;
  
  i_1 = idToInsert;
  if (idToInsert == -1) {
    i_1 = block.id;
  }
  bVar1 = Block::isHorizontal(&block);
  if (bVar1) {
    for (local_18 = block.column; local_18 < block.column + block.length; local_18 = local_18 + 1) {
      this->cells[block.row][local_18] = i_1;
    }
  }
  else {
    for (local_1c = block.row; block.row - block.length < local_1c; local_1c = local_1c + -1) {
      this->cells[local_1c][block.column] = i_1;
    }
  }
  return;
}

Assistant:

void Board::insert(Block block, int idToInsert) {

    // If the ID is not specified, use the block's id.
    if (idToInsert == -1) {
        idToInsert = block.id;
    }

    // Insert the values into the 2D board array with IDs for move checks and visualization.
    if (block.isHorizontal()) {
        for (int i = block.column; i < block.column + block.length; ++i) {
            this->cells[block.row][i] = idToInsert;
        }
    } else {
        for (int i = block.row; i > block.row - block.length; --i) {
            this->cells[i][block.column] = idToInsert;
        }
    }
}